

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackScriptFunction.cpp
# Opt level: O2

FrameDisplay * __thiscall
Js::StackScriptFunction::BoxState::BoxFrameDisplay(BoxState *this,FrameDisplay *frameDisplay)

{
  ushort uVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Recycler *alloc;
  WriteBarrierPtr<void> *ptr;
  uint index;
  undefined1 local_70 [8];
  TrackAllocData data;
  FrameDisplay *local_40;
  FrameDisplay *local_38;
  FrameDisplay *frameDisplay_local;
  
  local_38 = frameDisplay;
  if (frameDisplay == (FrameDisplay *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/StackScriptFunction.cpp"
                                ,0x264,"(frameDisplay != nullptr)","frameDisplay != nullptr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  else if (frameDisplay == (FrameDisplay *)&NullFrameDisplay) {
    return (FrameDisplay *)&NullFrameDisplay;
  }
  local_40 = (FrameDisplay *)0x0;
  bVar3 = JsUtil::
          BaseDictionary<void*,void*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetValue<Js::FrameDisplay*>
                    ((BaseDictionary<void*,void*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)&this->boxedValues,&local_38,&local_40);
  if (!bVar3) {
    uVar1 = local_38->length;
    bVar3 = ThreadContext::IsOnStack(local_38);
    data._32_8_ = local_38;
    if (bVar3) {
      data.typeinfo = (type_info *)(ulong)((uint)uVar1 * 8);
      local_70 = (undefined1  [8])&FrameDisplay::typeinfo;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_8dabb48;
      data.filename._0_4_ = 0x278;
      alloc = Memory::Recycler::TrackAllocInfo
                        (this->scriptContext->recycler,(TrackAllocData *)local_70);
      data._32_8_ = new<Memory::Recycler>(8,alloc,0x37ff80,0);
      ((FrameDisplay *)data._32_8_)->tag = true;
      ((FrameDisplay *)data._32_8_)->strictMode = false;
      ((FrameDisplay *)data._32_8_)->length = uVar1;
      ((FrameDisplay *)data._32_8_)->unused = 0;
    }
    local_70 = (undefined1  [8])local_38;
    local_40 = (FrameDisplay *)data._32_8_;
    JsUtil::
    BaseDictionary<void*,void*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<void*,void*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
              ((BaseDictionary<void*,void*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)&this->boxedValues,(void **)local_70,(void **)&data.line);
    for (index = 0; uVar1 != index; index = index + 1) {
      ptr = (WriteBarrierPtr<void> *)FrameDisplay::GetItem(local_38,index);
      if (ptr == (WriteBarrierPtr<void> *)0x0) {
        ptr = (WriteBarrierPtr<void> *)0x0;
      }
      else if (ptr->ptr < (void *)0x10000) {
        Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<void>_>::WriteBarrierSet
                  ((WriteBarrierPtr<Memory::WriteBarrierPtr<void>_> *)local_70,ptr);
        ptr = BoxScopeSlots(this,ptr,*(uint *)(void **)local_70);
      }
      FrameDisplay::SetItem(local_40,index,ptr);
      FrameDisplay::SetItem(local_38,index,ptr);
    }
  }
  return local_40;
}

Assistant:

FrameDisplay * StackScriptFunction::BoxState::BoxFrameDisplay(FrameDisplay * frameDisplay)
    {
        Assert(frameDisplay != nullptr);
        if (frameDisplay == &Js::NullFrameDisplay)
        {
            return frameDisplay;
        }

        FrameDisplay * boxedFrameDisplay = nullptr;
        if (boxedValues.TryGetValue(frameDisplay, (void **)&boxedFrameDisplay))
        {
            return boxedFrameDisplay;
        }

        // Create new frame display when we allocate the frame display on the stack
        uint16 length = frameDisplay->GetLength();
        if (!ThreadContext::IsOnStack(frameDisplay))
        {
            boxedFrameDisplay = frameDisplay;
        }
        else
        {
            boxedFrameDisplay = RecyclerNewPlus(scriptContext->GetRecycler(), length * sizeof(Var), FrameDisplay, length);
        }
        boxedValues.Add(frameDisplay, boxedFrameDisplay);

        for (uint16 i = 0; i < length; i++)
        {
            // TODO: Once we allocate the slots on the stack, we can only look those slots
            Field(Var) * pScope = (Field(Var) *)frameDisplay->GetItem(i);
            // We don't do stack slots if we exceed max encoded slot count
            if (ScopeSlots::Is(pScope))
            {
                pScope = BoxScopeSlots(pScope, static_cast<uint>(ScopeSlots(pScope).GetCount()));
            }
            boxedFrameDisplay->SetItem(i, pScope);
            frameDisplay->SetItem(i, pScope);
        }
        return boxedFrameDisplay;
    }